

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenInitializer::AddToSourceGroup
          (cmQtAutoGenInitializer *this,string *fileName,string *genNameUpper)

{
  bool bVar1;
  cmMakefile *this_00;
  cmState *this_01;
  char *pcVar2;
  cmSourceGroup *this_02;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *__range2;
  long lVar3;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> props;
  string groupName;
  string property;
  undefined1 local_c8 [64];
  string local_88;
  string local_68;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  this_00 = cmTarget::GetMakefile(this->Target->Target);
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 genNameUpper,"_SOURCE_GROUP");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_c8 + 0x20),"AUTOGEN_SOURCE_GROUP",(allocator<char> *)&local_68);
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x20) {
    this_01 = cmMakefile::GetState(this_00);
    pcVar2 = cmState::GetGlobalProperty(this_01,(string *)(local_c8 + lVar3));
    if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
      std::__cxx11::string::assign((char *)&local_88);
      std::__cxx11::string::operator=((string *)&local_48,(string *)(local_c8 + lVar3));
      break;
    }
  }
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *)local_c8);
  bVar1 = true;
  if (local_88._M_string_length != 0) {
    this_02 = cmMakefile::GetOrCreateSourceGroup(this_00,&local_88);
    if (this_02 != (cmSourceGroup *)0x0) goto LAB_002bdc0d;
    local_c8._0_8_ = local_c8 + 0x10;
    local_c8._8_8_ = 0;
    local_c8[0x10] = '\0';
    std::__cxx11::string::append((string *)local_c8);
    std::__cxx11::string::append(local_c8);
    std::__cxx11::string::append((string *)local_c8);
    std::__cxx11::string::append(local_c8);
    cmQtAutoGen::Quoted(&local_68,&local_88);
    std::__cxx11::string::append((string *)local_c8);
    std::__cxx11::string::~string((string *)&local_68);
    cmSystemTools::Error((string *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
    bVar1 = false;
  }
  this_02 = (cmSourceGroup *)0x0;
LAB_002bdc0d:
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  if ((bVar1) && (this_02 != (cmSourceGroup *)0x0)) {
    cmSourceGroup::AddGroupFile(this_02,fileName);
  }
  return bVar1;
}

Assistant:

bool cmQtAutoGenInitializer::AddToSourceGroup(std::string const& fileName,
                                              std::string const& genNameUpper)
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmSourceGroup* sourceGroup = nullptr;
  // Acquire source group
  {
    std::string property;
    std::string groupName;
    {
      // Prefer generator specific source group name
      std::array<std::string, 2> props{ { genNameUpper + "_SOURCE_GROUP",
                                          "AUTOGEN_SOURCE_GROUP" } };
      for (std::string& prop : props) {
        const char* propName = makefile->GetState()->GetGlobalProperty(prop);
        if ((propName != nullptr) && (*propName != '\0')) {
          groupName = propName;
          property = std::move(prop);
          break;
        }
      }
    }
    // Generate a source group on demand
    if (!groupName.empty()) {
      sourceGroup = makefile->GetOrCreateSourceGroup(groupName);
      if (sourceGroup == nullptr) {
        std::string err;
        err += genNameUpper;
        err += " error in ";
        err += property;
        err += ": Could not find or create the source group ";
        err += cmQtAutoGen::Quoted(groupName);
        cmSystemTools::Error(err);
        return false;
      }
    }
  }
  if (sourceGroup != nullptr) {
    sourceGroup->AddGroupFile(fileName);
  }
  return true;
}